

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int exprMightBeIndexed2(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr)

{
  int iTab;
  Index *pIVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  Index **ppIVar5;
  long lVar6;
  
  piVar4 = &pFrom->a[0].iCursor;
  for (; 1 < mPrereq; mPrereq = mPrereq >> 1) {
    piVar4 = piVar4 + 0x1c;
  }
  iTab = *piVar4;
  ppIVar5 = &(*(Table **)(piVar4 + -9))->pIndex;
  do {
    pIVar1 = *ppIVar5;
    if (pIVar1 == (Index *)0x0) {
      return 0;
    }
    if (pIVar1->aColExpr != (ExprList *)0x0) {
      lVar6 = 4;
      for (uVar3 = 0; uVar3 < pIVar1->nKeyCol; uVar3 = uVar3 + 1) {
        if ((pIVar1->aiColumn[uVar3] == -2) &&
           (iVar2 = sqlite3ExprCompareSkip
                              (pExpr,*(Expr **)((long)pIVar1->aColExpr->a + lVar6 * 2 + -8),iTab),
           iVar2 == 0)) {
          *aiCurCol = iTab;
          aiCurCol[1] = -2;
          return 1;
        }
        lVar6 = lVar6 + 0x10;
      }
    }
    ppIVar5 = &pIVar1->pNext;
  } while( true );
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr            /* An operand of a comparison operator */
){
  Index *pIdx;
  int i;
  int iCur;
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompareSkip(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        aiCurCol[0] = iCur;
        aiCurCol[1] = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}